

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O2

void controlbitsfrompermutation(int w,int n,int step,int off,uchar *c,uint32_t *pi)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uchar *puVar4;
  uint32_t *y;
  undefined8 uVar5;
  int w_00;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint32_t *puVar13;
  undefined4 in_register_00000014;
  uint32_t *puVar14;
  undefined4 in_register_00000034;
  undefined4 in_register_0000003c;
  uint32_t *puVar15;
  uint32_t *puVar16;
  int iVar17;
  uint32_t *puVar18;
  bool bVar19;
  uint32_t auStack_c0 [4];
  uint32_t *local_b0;
  uint32_t *local_a8;
  uint32_t *local_a0;
  uint32_t *local_98;
  long local_90;
  uint32_t *local_88;
  uchar *local_80;
  ulong local_78;
  uint32_t *local_70;
  uint32_t *local_68;
  undefined8 local_60;
  undefined8 local_58;
  ulong local_50;
  ulong local_48;
  int local_3c;
  undefined8 local_38;
  
  local_60 = CONCAT44(in_register_00000014,step);
  uVar7 = (ulong)(uint)n * 4 + 0xf & 0xfffffffffffffff0;
  puVar18 = (uint32_t *)((long)auStack_c0 + (8 - uVar7));
  local_48 = (ulong)(uint)(n * 2);
  uVar12 = (ulong)(uint)(n * 2) * 4 + 0xf & 0xfffffffffffffff0;
  puVar16 = (uint32_t *)((long)((long)puVar18 - uVar12) - uVar12);
  local_b0 = (uint32_t *)((long)puVar16 - uVar12);
  puVar15 = (uint32_t *)((long)((long)puVar16 - uVar12) - uVar12);
  puVar13 = (uint32_t *)((long)puVar15 - uVar7);
  local_70 = puVar13;
  puVar13[-2] = 2;
  puVar13[-1] = 0;
  local_58 = CONCAT44(in_register_00000034,n);
  local_50 = (long)n / (long)(int)*(undefined8 *)(puVar13 + -2) & 0xffffffff;
  puVar13 = (uint32_t *)((long)puVar13 - (local_50 * 8 + 0xf & 0xfffffffffffffff0));
  local_38 = CONCAT44(in_register_0000003c,w);
  if (w == 1) {
    uVar6 = *pi;
    puVar13[-2] = 8;
    puVar13[-1] = 0;
    c[off / (int)*(undefined8 *)(puVar13 + -2)] =
         c[off / (int)*(undefined8 *)(puVar13 + -2)] | (byte)((uVar6 & 1) << ((byte)off & 7));
  }
  else if (1 < w) {
    uVar8 = 0;
    uVar7 = 0;
    local_80 = c;
    if (0 < n) {
      uVar7 = (ulong)(uint)n;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      puVar18[uVar8] = (uint32_t)uVar8;
    }
    iVar17 = (int)local_58;
    local_a0 = puVar15;
    local_98 = puVar13;
    local_78 = uVar7;
    local_68 = (uint32_t *)((long)puVar18 - uVar12);
    local_3c = off;
    puVar13[-2] = 0x1027c7;
    puVar13[-1] = 0;
    composeinv(iVar17,puVar18,puVar18,pi);
    puVar15 = local_68;
    puVar13[-2] = 1;
    puVar13[-1] = 0;
    uVar6 = (int)*(undefined8 *)(puVar13 + -2) << ((byte)local_38 & 0x1f);
    local_90 = (long)iVar17;
    for (uVar7 = 0; local_78 != uVar7; uVar7 = uVar7 + 1) {
      puVar15[uVar7] = puVar18[uVar7] | uVar6;
      puVar15[(long)iVar17 + uVar7] = pi[uVar7];
    }
    uVar7 = 0;
    uVar12 = 0;
    if (0 < (int)local_48) {
      uVar12 = local_48 & 0xffffffff;
    }
    for (; uVar12 != uVar7; uVar7 = uVar7 + 1) {
      uVar10 = (uint)uVar7;
      puVar16[uVar7] =
           ((uVar10 & 1) << ((byte)local_38 & 0x1f)) +
           (uVar6 - 2 & uVar10) + (uVar10 >> ((byte)local_38 & 0x1f));
    }
    local_88 = puVar16;
    local_a8 = pi;
    for (iVar17 = 0; uVar7 = local_48, uVar2 = local_58, uVar5 = local_60, puVar14 = local_70,
        puVar4 = local_80, puVar16 = local_88, puVar18 = local_b0, iVar17 != (int)local_38;
        iVar17 = iVar17 + 1) {
      puVar13[-2] = 0x10286f;
      puVar13[-1] = 0;
      composeinv((int)uVar7,puVar18,puVar16,puVar15);
      uVar7 = uVar12;
      while (uVar5 = local_38, uVar8 = local_48, y = local_68, puVar14 = local_88,
            puVar15 = local_a0, bVar19 = uVar7 != 0, uVar7 = uVar7 - 1, bVar19) {
        puVar13[-2] = 0x10288d;
        puVar13[-1] = 0;
        flow((int)uVar5,puVar16,puVar18,iVar17);
        puVar18 = puVar18 + 1;
        puVar16 = puVar16 + 1;
      }
      for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
        local_a0[uVar7] = local_68[uVar7 ^ 1];
      }
      puVar13[-2] = 0x1028cf;
      puVar13[-1] = 0;
      composeinv((int)uVar8,y,y,puVar15);
      for (uVar7 = 0; uVar8 = uVar12, uVar12 != uVar7; uVar7 = uVar7 + 1) {
        puVar15[uVar7] = puVar14[uVar7 ^ 1];
      }
      while (uVar5 = local_38, uVar8 != 0) {
        puVar13[-2] = 1;
        puVar13[-1] = 0;
        uVar2 = *(undefined8 *)(puVar13 + -2);
        puVar13[-2] = 0x102905;
        puVar13[-1] = 0;
        flow((int)uVar5,puVar14,puVar15,(int)uVar2);
        puVar15 = puVar15 + 1;
        puVar14 = puVar14 + 1;
        uVar8 = uVar8 - 1;
      }
      puVar15 = local_68;
    }
    for (uVar7 = 0; local_78 != uVar7; uVar7 = uVar7 + 1) {
      local_70[uVar7] = local_a8[uVar7];
    }
    uVar7 = 0;
    uVar12 = 0;
    if (0 < (int)local_50) {
      uVar12 = local_50 & 0xffffffff;
    }
    puVar13[-2] = 8;
    lVar9 = local_90;
    puVar13[-1] = 0;
    uVar3 = *(undefined8 *)(puVar13 + -2);
    iVar17 = local_3c;
    while( true ) {
      iVar11 = (int)uVar5;
      uVar6 = (uint)local_38;
      if (uVar12 == uVar7) break;
      pbVar1 = puVar4 + iVar17 / (int)uVar3;
      *pbVar1 = *pbVar1 | ((puVar16[uVar7 * 2] >> (uVar6 & 0x1f) & 1) != 0) << ((byte)iVar17 & 7);
      uVar7 = uVar7 + 1;
      iVar17 = iVar17 + iVar11;
    }
    local_48 = CONCAT44(local_48._4_4_,uVar6 - 1);
    iVar17 = (int)uVar2 * iVar11 * (uVar6 - 1) + local_3c;
    for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
      pbVar1 = puVar4 + iVar17 / (int)uVar3;
      *pbVar1 = *pbVar1 | ((puVar16[local_90 + uVar7 * 2] >> (uVar6 & 0x1f) & 1) != 0) <<
                          ((byte)iVar17 & 7);
      iVar17 = iVar17 + iVar11;
    }
    for (uVar7 = 0; uVar8 = local_50, puVar18 = local_98, uVar12 != uVar7; uVar7 = uVar7 + 1) {
      uVar6 = puVar16[lVar9 + uVar7 * 2];
      uVar10 = (uint)local_38;
      puVar13[-2] = 0x102a10;
      puVar13[-1] = 0;
      cswap(puVar14,puVar14 + 1,(uVar6 >> (uVar10 & 0x1f) & 1) != 0);
      puVar14 = puVar14 + 2;
    }
    puVar15 = local_98;
    puVar16 = local_70;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
        puVar15[uVar7] = puVar16[uVar7 * 2] >> 1;
      }
      puVar15 = puVar15 + local_50;
      puVar16 = puVar16 + 1;
    }
    iVar17 = (int)local_60;
    iVar11 = local_3c + (int)local_50 * iVar17;
    puVar13[-2] = 2;
    puVar13[-1] = 0;
    lVar9 = *(long *)(puVar13 + -2);
    while (uVar7 = local_50, puVar4 = local_80, bVar19 = lVar9 != 0, lVar9 = lVar9 + -1, bVar19) {
      w_00 = (int)local_48;
      puVar13[-2] = 0x102a97;
      puVar13[-1] = 0;
      controlbitsfrompermutation(w_00,(int)uVar7,iVar17 * 2,iVar11,puVar4,puVar18);
      iVar11 = iVar11 + (int)local_60;
      puVar18 = puVar18 + uVar8;
    }
  }
  return;
}

Assistant:

static void controlbitsfrompermutation(int w, int n, int step, int off, unsigned char *c, uint32_t pi[n])
{
  int i;
  int j;
  int k;
  int t;
  uint32_t ip[n];
  uint32_t I[2 * n];
  uint32_t P[2 * n];
  uint32_t PI[2 * n];
  uint32_t T[2 * n];
  uint32_t piflip[n];
  uint32_t subpi[2][n / 2];

  if (w == 1) c[ off/8 ] |= (pi[0] & 1) << (off%8);
  if (w <= 1) return;

  invert(n,ip,pi);

  for (i = 0;i < n;++i) 
  {
    I[i] = ip[i] | (1 << w);
    I[n + i] = pi[i];
  }

  for (i = 0;i < 2 * n;++i)
      P[i] = (i >> w) + (i & ((1<<w)-2)) + ((i & 1) << w);

  for (t = 0;t < w;++t) 
  {
    composeinv(2 * n,PI,P,I);

    for (i = 0;i < 2 * n;++i)
      flow(w,&P[i],&PI[i],t);

    for (i = 0;i < 2 * n;++i)
	T[i] = I[i ^ 1];

    composeinv(2 * n,I,I,T);

    for (i = 0;i < 2 * n;++i)
	T[i] = P[i ^ 1];

    for (i = 0;i < 2 * n;++i)
      flow(w,&P[i],&T[i],1);
  }

  for (i = 0;i < n;++i)
    for (j = 0;j < w;++j)
      piflip[i] = pi[i];

  for (i = 0;i < n / 2;++i) c[ (off + i * step)/8 ] |= ((P[i * 2] >> w) & 1) << ((off + i * step)%8);
  for (i = 0;i < n / 2;++i) c[ (off + ((w-1)*n + i) * step)/8 ] |= ((P[n + i * 2] >> w) & 1) << ((off + ((w-1)*n + i) * step)%8);

  for (i = 0;i < n / 2;++i)
    cswap(&piflip[i * 2], &piflip[i * 2 + 1], (P[n + i * 2] >> w) & 1);

  for (k = 0;k < 2;++k)
    for (i = 0;i < n / 2;++i)
        subpi[k][i] = piflip[i * 2 + k] >> 1;

  for (k = 0;k < 2;++k)
    controlbitsfrompermutation(w - 1, n / 2, step * 2, off + step * (n/2 + k), c, subpi[k]);
}